

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GIC.h
# Opt level: O2

void __thiscall
Gudhi::cover_complex::Cover_complex<std::vector<float,_std::allocator<float>_>_>::set_graph_from_OFF
          (Cover_complex<std::vector<float,_std::allocator<float>_>_> *this)

{
  ostream *poVar1;
  
  remove_edges(this,&this->one_skeleton);
  if (*(size_t *)
       ((long)&(this->one_skeleton_OFF).m_graph.super_type.m_edges.
               super__List_base<boost::list_edge<unsigned_long,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>_>_>_>
               ._M_impl._M_node + 0x10) != 0) {
    boost::
    subgraph<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>,_boost::no_property,_boost::listS>_>
    ::operator=(&this->one_skeleton,&this->one_skeleton_OFF);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"No triangulation read in OFF file!");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void set_graph_from_OFF() {
    remove_edges(one_skeleton);
    if (num_edges(one_skeleton_OFF))
      one_skeleton = one_skeleton_OFF;
    else
      std::cerr << "No triangulation read in OFF file!" << std::endl;
  }